

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall DStoredCommand::Tick(DStoredCommand *this)

{
  undefined1 local_38 [8];
  FCommandLine args;
  DStoredCommand *this_local;
  
  args._32_8_ = this;
  if ((this->Text != (char *)0x0) && (this->Command != (FConsoleCommand *)0x0)) {
    FCommandLine::FCommandLine((FCommandLine *)local_38,this->Text,false);
    (*this->Command->_vptr_FConsoleCommand[3])
              (this->Command,(FCommandLine *)local_38,(&players)[(long)consoleplayer * 0x54],0);
    FCommandLine::~FCommandLine((FCommandLine *)local_38);
  }
  (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
  return;
}

Assistant:

void DStoredCommand::Tick ()
{
	if (Text != NULL && Command != NULL)
	{
		FCommandLine args (Text);
		Command->Run (args, players[consoleplayer].mo, 0);
	}
	Destroy ();
}